

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uppity.c
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  undefined8 uVar2;
  ptrlen pl;
  FILE *pFVar3;
  _Bool _Var4;
  int iVar5;
  uint uVar6;
  ssh_keyalg *psVar7;
  ssh_keyalg *psVar8;
  void *pvVar9;
  undefined8 *puVar10;
  RSAKey *rsa;
  FILE *__stream;
  int *piVar11;
  char *pcVar12;
  strbuf *psVar13;
  Filename *pFVar14;
  ptrlen pVar15;
  ulong local_230;
  size_t i_2;
  size_t i_1;
  Filename *logfile_1;
  Filename *logfile;
  void *local_208;
  ulong local_200;
  unsigned_long mask;
  ptrlen word;
  ptrlen list;
  uint method_1;
  uint method;
  size_t local_1c8;
  void *local_1c0;
  size_t local_1b8;
  void *local_1b0;
  size_t local_1a8;
  void *local_1a0;
  size_t local_198;
  void *local_190;
  size_t local_188;
  void *local_180;
  size_t local_178;
  void *local_170;
  size_t local_168;
  void *local_160;
  size_t local_158;
  void *local_150;
  size_t local_148;
  void *local_140;
  size_t local_138;
  strbuf *sb_2;
  FILE *fp;
  AuthPolicy_ssh1_pubkey *node_1;
  BinarySource src [1];
  strbuf *sb_1;
  size_t local_d0;
  void *blob;
  AuthPolicy_ssh2_pubkey *node;
  strbuf *sb;
  char *error_2;
  Filename *pFStack_a0;
  int keytype_2;
  Filename *keyfile_2;
  char *error_1;
  Filename *pFStack_88;
  int keytype_1;
  Filename *keyfile_1;
  char *pcStack_78;
  int i;
  char *invalid;
  ssh_key *key;
  ssh2_userkey *uk;
  char *error;
  Filename *pFStack_50;
  int keytype;
  Filename *keyfile;
  char *val;
  char *arg;
  cmdline_instance *ci;
  cmdline_instance *instances;
  size_t instancessize;
  size_t ninstances;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  instancessize = 0;
  instances = (cmdline_instance *)0x8;
  ninstances = (size_t)argv;
  argv_local._0_4_ = argc;
  ci = (cmdline_instance *)safemalloc(8,0x110,0);
  arg = (char *)(ci + instancessize);
  instancessize = instancessize + 1;
  init_cmdline_instance((cmdline_instance *)arg);
  if ((int)argv_local < 2) {
    show_help((FILE *)_stderr);
    fputc(10,_stderr);
  }
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  while( true ) {
                    while( true ) {
                      argv_local._0_4_ = (int)argv_local + -1;
                      if ((int)argv_local < 1) {
                        if ((1 < instancessize) && ((listen_once & 1U) != 0)) {
                          fprintf(_stderr,
                                  "%s: cannot listen once only with multiple server instances\n",
                                  "Uppity");
                          exit(1);
                        }
                        i_2 = 0;
                        while( true ) {
                          if (instancessize <= i_2) {
                            random_ref();
                            putty_signal(0xd,(_func_void_int *)0x1);
                            sk_init();
                            uxsel_init();
                            for (local_230 = 0; local_230 < instancessize; local_230 = local_230 + 1
                                ) {
                              cmdline_instance_start(ci + local_230);
                            }
                            cli_main_loop(cliloop_no_pw_setup,cliloop_no_pw_check,
                                          cliloop_always_continue,(void *)0x0);
                            return 0;
                          }
                          arg = (char *)(ci + i_2);
                          if ((((cmdline_instance *)arg)->nhostkeys == 0) &&
                             (((cmdline_instance *)arg)->hostkey1 == (RSAKey *)0x0)) break;
                          if (((1 < instancessize) && (((cmdline_instance *)arg)->listen_port < 0))
                             && (((cmdline_instance *)arg)->listen_socket == (char *)0x0)) {
                            fprintf(_stderr,
                                    "%s: cannot talk to stdio with multiple server instances\n",
                                    "Uppity");
                            exit(1);
                          }
                          i_2 = i_2 + 1;
                        }
                        fprintf(_stderr,"%s: specify at least one host key\n","Uppity");
                        exit(1);
                      }
                      val = *(char **)(ninstances + 8);
                      ninstances = ninstances + 8;
                      iVar5 = strcmp(val,"--help");
                      if (iVar5 == 0) {
                        show_help(_stdout);
                        exit(0);
                      }
                      _Var4 = longoptnoarg(val,"--version");
                      if (!_Var4) break;
                      show_version_and_exit();
                    }
                    _Var4 = longoptnoarg(val,"--verbose");
                    if ((!_Var4) && (iVar5 = strcmp(val,"-v"), iVar5 != 0)) break;
                    verbose = true;
                  }
                  _Var4 = longoptnoarg(val,"--and");
                  if (!_Var4) break;
                  ci = (cmdline_instance *)
                       safegrowarray(ci,(size_t *)&instances,0x110,instancessize,1,false);
                  arg = (char *)(ci + instancessize);
                  instancessize = instancessize + 1;
                  init_cmdline_instance((cmdline_instance *)arg);
                }
                _Var4 = longoptarg(val,"--listen",(char **)&keyfile,(int *)&argv_local,
                                   (char ***)&ninstances);
                if (!_Var4) break;
                if (*(char *)&keyfile->path == '/') {
                  arg[0] = -1;
                  arg[1] = -1;
                  arg[2] = -1;
                  arg[3] = -1;
                  *(Filename **)(arg + 8) = keyfile;
                }
                else {
                  iVar5 = atoi((char *)keyfile);
                  *(int *)arg = iVar5;
                  arg[8] = '\0';
                  arg[9] = '\0';
                  arg[10] = '\0';
                  arg[0xb] = '\0';
                  arg[0xc] = '\0';
                  arg[0xd] = '\0';
                  arg[0xe] = '\0';
                  arg[0xf] = '\0';
                }
              }
              iVar5 = strcmp(val,"--listen-once");
              if (iVar5 != 0) break;
              listen_once = true;
            }
            _Var4 = longoptarg(val,"--hostkey",(char **)&keyfile,(int *)&argv_local,
                               (char ***)&ninstances);
            if (!_Var4) break;
            pFStack_50 = filename_from_str((char *)keyfile);
            error._4_4_ = key_type(pFStack_50);
            pFVar3 = _stderr;
            if (error._4_4_ == 3) {
              key = (ssh_key *)ppk_load_f(pFStack_50,(char *)0x0,(char **)&uk);
              filename_free(pFStack_50);
              if ((key == (ssh_key *)0x0) || (key->vt == (ssh_keyalg *)0x0)) {
                fprintf(_stderr,"%s: unable to load host key \'%s\': %s\n","Uppity",keyfile,uk);
                exit(1);
              }
              pcStack_78 = ssh_key_invalid((ssh_key *)key->vt,0);
              if (pcStack_78 != (char *)0x0) {
                fprintf(_stderr,"%s: host key \'%s\' is unusable: %s\n","Uppity",keyfile,pcStack_78)
                ;
                exit(1);
              }
              invalid = (char *)key->vt;
              safefree(key[1].vt);
              safefree(key);
              for (keyfile_1._4_4_ = 0; (ulong)(long)keyfile_1._4_4_ < *(ulong *)(arg + 0x18);
                  keyfile_1._4_4_ = keyfile_1._4_4_ + 1) {
                psVar7 = ssh_key_alg(*(ssh_key **)
                                      (*(long *)(arg + 0x10) + (long)keyfile_1._4_4_ * 8));
                psVar8 = ssh_key_alg((ssh_key *)invalid);
                pFVar3 = _stderr;
                if (psVar7 == psVar8) {
                  psVar7 = ssh_key_alg((ssh_key *)invalid);
                  fprintf(pFVar3,"%s: host key \'%s\' duplicates key type %s\n","Uppity",keyfile,
                          psVar7->ssh_id);
                  exit(1);
                }
              }
              pvVar9 = safegrowarray(*(void **)(arg + 0x10),(size_t *)(arg + 0x20),8,
                                     *(size_t *)(arg + 0x18),1,false);
              *(void **)(arg + 0x10) = pvVar9;
              lVar1 = *(long *)(arg + 0x18);
              *(long *)(arg + 0x18) = lVar1 + 1;
              *(char **)(*(long *)(arg + 0x10) + lVar1 * 8) = invalid;
            }
            else {
              if (error._4_4_ != 2) {
                pcVar12 = key_type_to_str(error._4_4_);
                fprintf(pFVar3,"%s: \'%s\' is not loadable as a private key (%s)","Uppity",keyfile,
                        pcVar12);
                exit(1);
              }
              if (*(long *)(arg + 0x28) != 0) {
                fprintf(_stderr,"%s: host key \'%s\' is a redundant SSH-1 host key\n","Uppity",
                        keyfile);
                exit(1);
              }
              pvVar9 = safemalloc(1,0x48,0);
              *(void **)(arg + 0x28) = pvVar9;
              iVar5 = rsa1_load_f(pFStack_50,*(RSAKey **)(arg + 0x28),(char *)0x0,(char **)&uk);
              if (iVar5 == 0) {
                fprintf(_stderr,"%s: unable to load host key \'%s\': %s\n","Uppity",keyfile,uk);
                exit(1);
              }
            }
          }
          _Var4 = longoptarg(val,"--rsakexkey",(char **)&keyfile,(int *)&argv_local,
                             (char ***)&ninstances);
          if (!_Var4) break;
          pFStack_88 = filename_from_str((char *)keyfile);
          error_1._4_4_ = key_type(pFStack_88);
          pFVar3 = _stderr;
          if (error_1._4_4_ != 2) {
            pcVar12 = key_type_to_str(error_1._4_4_);
            fprintf(pFVar3,"%s: \'%s\' is not loadable as an SSH-1 format private key (%s)","Uppity"
                    ,keyfile,pcVar12);
            exit(1);
          }
          if (*(long *)(arg + 0x58) == 0) {
            pvVar9 = safemalloc(1,0x48,0);
            *(void **)(arg + 0x58) = pvVar9;
          }
          else {
            freersakey(*(RSAKey **)(arg + 0x58));
          }
          iVar5 = rsa1_load_f(pFStack_88,*(RSAKey **)(arg + 0x58),(char *)0x0,(char **)&keyfile_2);
          if (iVar5 == 0) {
            fprintf(_stderr,"%s: unable to load RSA kex key \'%s\': %s\n","Uppity",keyfile,keyfile_2
                   );
            exit(1);
          }
          *(ssh_keyalg **)(*(long *)(arg + 0x58) + 0x40) = &ssh_rsa;
        }
        _Var4 = longoptarg(val,"--userkey",(char **)&keyfile,(int *)&argv_local,
                           (char ***)&ninstances);
        if (!_Var4) break;
        pFStack_a0 = filename_from_str((char *)keyfile);
        error_2._4_4_ = key_type(pFStack_a0);
        pFVar3 = _stderr;
        if ((error_2._4_4_ == 9) || (error_2._4_4_ == 10)) {
          psVar13 = strbuf_new();
          _Var4 = ppk_loadpub_f(pFStack_a0,(char **)0x0,psVar13->binarysink_,(char **)0x0,
                                (char **)&sb);
          if (!_Var4) {
            fprintf(_stderr,"%s: unable to load user key \'%s\': %s\n","Uppity",keyfile,sb);
            exit(1);
          }
          puVar10 = (undefined8 *)safemalloc(1,0x18,psVar13->len);
          memcpy(puVar10 + 3,psVar13->u,psVar13->len);
          pVar15 = make_ptrlen(puVar10 + 3,psVar13->len);
          sb_1 = (strbuf *)pVar15.ptr;
          *puVar10 = sb_1;
          local_d0 = pVar15.len;
          puVar10[1] = local_d0;
          puVar10[2] = *(undefined8 *)(arg + 0x40);
          *(undefined8 **)(arg + 0x40) = puVar10;
          strbuf_free(psVar13);
        }
        else {
          if (error_2._4_4_ != 8) {
            pcVar12 = key_type_to_str(error_2._4_4_);
            fprintf(pFVar3,"%s: \'%s\' is not loadable as a public key (%s)\n","Uppity",keyfile,
                    pcVar12);
            exit(1);
          }
          src[0].binarysource_ = (BinarySource *)strbuf_new();
          iVar5 = rsa1_loadpub_f(pFStack_a0,((strbuf *)src[0].binarysource_)->binarysink_,
                                 (char **)0x0,(char **)&sb);
          if (iVar5 == 0) {
            fprintf(_stderr,"%s: unable to load user key \'%s\': %s\n","Uppity",keyfile,sb);
            exit(1);
          }
          rsa = (RSAKey *)safemalloc(1,0x50,0);
          pVar15 = make_ptrlen((void *)(src[0].binarysource_)->pos,(src[0].binarysource_)->len);
          BinarySource_INIT__((BinarySource *)&node_1,pVar15);
          BinarySource_get_rsa_ssh1_pub((BinarySource *)src[0]._24_8_,rsa,RSA_SSH1_EXPONENT_FIRST);
          uVar2 = *(undefined8 *)(arg + 0x38);
          rsa[1].bits = (int)uVar2;
          rsa[1].bytes = (int)((ulong)uVar2 >> 0x20);
          *(RSAKey **)(arg + 0x38) = rsa;
          strbuf_free((strbuf *)src[0].binarysource_);
        }
      }
      _Var4 = longoptarg(val,"--bannerfile",(char **)&keyfile,(int *)&argv_local,
                         (char ***)&ninstances);
      if (_Var4) break;
      _Var4 = longoptarg(val,"--bannertext",(char **)&keyfile,(int *)&argv_local,
                         (char ***)&ninstances);
      pcVar12 = arg;
      if (_Var4) {
        pVar15 = ptrlen_from_asciz((char *)keyfile);
        local_150 = pVar15.ptr;
        *(void **)(pcVar12 + 0x60) = local_150;
        local_148 = pVar15.len;
        *(size_t *)(pcVar12 + 0x68) = local_148;
      }
      else {
        _Var4 = longoptarg(val,"--sessiondir",(char **)&keyfile,(int *)&argv_local,
                           (char ***)&ninstances);
        if (_Var4) {
          *(Filename **)(arg + 0x50) = keyfile;
        }
        else {
          _Var4 = longoptarg(val,"--kexinit-kex",(char **)&keyfile,(int *)&argv_local,
                             (char ***)&ninstances);
          pcVar12 = arg;
          if (_Var4) {
            pVar15 = ptrlen_from_asciz((char *)keyfile);
            local_160 = pVar15.ptr;
            *(void **)(pcVar12 + 0x70) = local_160;
            local_158 = pVar15.len;
            *(size_t *)(pcVar12 + 0x78) = local_158;
          }
          else {
            _Var4 = longoptarg(val,"--kexinit-hostkey",(char **)&keyfile,(int *)&argv_local,
                               (char ***)&ninstances);
            pcVar12 = arg;
            if (_Var4) {
              pVar15 = ptrlen_from_asciz((char *)keyfile);
              local_170 = pVar15.ptr;
              *(void **)(pcVar12 + 0x80) = local_170;
              local_168 = pVar15.len;
              *(size_t *)(pcVar12 + 0x88) = local_168;
            }
            else {
              _Var4 = longoptarg(val,"--kexinit-cscipher",(char **)&keyfile,(int *)&argv_local,
                                 (char ***)&ninstances);
              pcVar12 = arg;
              if (_Var4) {
                pVar15 = ptrlen_from_asciz((char *)keyfile);
                local_180 = pVar15.ptr;
                *(void **)(pcVar12 + 0x90) = local_180;
                local_178 = pVar15.len;
                *(size_t *)(pcVar12 + 0x98) = local_178;
              }
              else {
                _Var4 = longoptarg(val,"--kexinit-csmac",(char **)&keyfile,(int *)&argv_local,
                                   (char ***)&ninstances);
                pcVar12 = arg;
                if (_Var4) {
                  pVar15 = ptrlen_from_asciz((char *)keyfile);
                  local_190 = pVar15.ptr;
                  *(void **)(pcVar12 + 0xb0) = local_190;
                  local_188 = pVar15.len;
                  *(size_t *)(pcVar12 + 0xb8) = local_188;
                }
                else {
                  _Var4 = longoptarg(val,"--kexinit-cscomp",(char **)&keyfile,(int *)&argv_local,
                                     (char ***)&ninstances);
                  pcVar12 = arg;
                  if (_Var4) {
                    pVar15 = ptrlen_from_asciz((char *)keyfile);
                    local_1a0 = pVar15.ptr;
                    *(void **)(pcVar12 + 0xd0) = local_1a0;
                    local_198 = pVar15.len;
                    *(size_t *)(pcVar12 + 0xd8) = local_198;
                  }
                  else {
                    _Var4 = longoptarg(val,"--kexinit-sccipher",(char **)&keyfile,(int *)&argv_local
                                       ,(char ***)&ninstances);
                    pcVar12 = arg;
                    if (_Var4) {
                      pVar15 = ptrlen_from_asciz((char *)keyfile);
                      local_1b0 = pVar15.ptr;
                      *(void **)(pcVar12 + 0xa0) = local_1b0;
                      local_1a8 = pVar15.len;
                      *(size_t *)(pcVar12 + 0xa8) = local_1a8;
                    }
                    else {
                      _Var4 = longoptarg(val,"--kexinit-scmac",(char **)&keyfile,(int *)&argv_local,
                                         (char ***)&ninstances);
                      pcVar12 = arg;
                      if (_Var4) {
                        pVar15 = ptrlen_from_asciz((char *)keyfile);
                        local_1c0 = pVar15.ptr;
                        *(void **)(pcVar12 + 0xc0) = local_1c0;
                        local_1b8 = pVar15.len;
                        *(size_t *)(pcVar12 + 200) = local_1b8;
                      }
                      else {
                        _Var4 = longoptarg(val,"--kexinit-sccomp",(char **)&keyfile,
                                           (int *)&argv_local,(char ***)&ninstances);
                        pcVar12 = arg;
                        if (_Var4) {
                          pVar15 = ptrlen_from_asciz((char *)keyfile);
                          _method_1 = pVar15.ptr;
                          *(void **)(pcVar12 + 0xe0) = _method_1;
                          local_1c8 = pVar15.len;
                          *(size_t *)(pcVar12 + 0xe8) = local_1c8;
                        }
                        else {
                          _Var4 = longoptarg(val,"--allow-auth",(char **)&keyfile,(int *)&argv_local
                                             ,(char ***)&ninstances);
                          if (_Var4) {
                            uVar6 = auth_method_from_name((char *)keyfile);
                            if (uVar6 == 0) {
                              fprintf(_stderr,"%s: unrecognised auth method \'%s\'\n","Uppity",
                                      keyfile);
                              exit(1);
                            }
                            *(uint *)(arg + 0x30) = uVar6 | *(uint *)(arg + 0x30);
                          }
                          else {
                            _Var4 = longoptarg(val,"--deny-auth",(char **)&keyfile,
                                               (int *)&argv_local,(char ***)&ninstances);
                            if (_Var4) {
                              uVar6 = auth_method_from_name((char *)keyfile);
                              if (uVar6 == 0) {
                                fprintf(_stderr,"%s: unrecognised auth method \'%s\'\n","Uppity",
                                        keyfile);
                                exit(1);
                              }
                              *(uint *)(arg + 0x30) = (uVar6 ^ 0xffffffff) & *(uint *)(arg + 0x30);
                            }
                            else {
                              _Var4 = longoptarg(val,"--ssh1-ciphers",(char **)&keyfile,
                                                 (int *)&argv_local,(char ***)&ninstances);
                              if (_Var4) {
                                join_0x00000010_0x00000000_ = ptrlen_from_asciz((char *)keyfile);
                                local_200 = 0;
                                while( true ) {
                                  pVar15 = ptrlen_get_word((ptrlen *)&word.len,",");
                                  logfile = (Filename *)pVar15.ptr;
                                  local_208 = (void *)pVar15.len;
                                  word.ptr = local_208;
                                  if (local_208 == (void *)0x0) break;
                                  _Var4 = ptrlen_eq_string(pVar15,"3des");
                                  if (_Var4) {
                                    local_200 = local_200 | 8;
                                  }
                                  else {
                                    pVar15.len = (size_t)word.ptr;
                                    pVar15.ptr = logfile;
                                    _Var4 = ptrlen_eq_string(pVar15,"blowfish");
                                    if (_Var4) {
                                      local_200 = local_200 | 0x40;
                                    }
                                    else {
                                      pl.len = (size_t)word.ptr;
                                      pl.ptr = logfile;
                                      _Var4 = ptrlen_eq_string(pl,"des");
                                      pFVar3 = _stderr;
                                      if (!_Var4) {
                                        uVar6 = string_length_for_printf((size_t)word.ptr);
                                        fprintf(pFVar3,"%s: unrecognised SSH-1 cipher \'%.*s\'\n",
                                                "Uppity",(ulong)uVar6,logfile);
                                        exit(1);
                                      }
                                      local_200 = local_200 | 4;
                                    }
                                  }
                                }
                                *(ulong *)(arg + 0xf8) = local_200;
                              }
                              else {
                                _Var4 = longoptnoarg(val,"--ssh1-no-compression");
                                if (_Var4) {
                                  arg[0x100] = '\0';
                                }
                                else {
                                  _Var4 = longoptnoarg(val,"--exitsignum");
                                  if (_Var4) {
                                    arg[0xf0] = '\x01';
                                  }
                                  else {
                                    _Var4 = longoptarg(val,"--sshlog",(char **)&keyfile,
                                                       (int *)&argv_local,(char ***)&ninstances);
                                    if ((_Var4) ||
                                       (_Var4 = longoptarg(val,"-sshlog",(char **)&keyfile,
                                                           (int *)&argv_local,(char ***)&ninstances)
                                       , _Var4)) {
                                      pFVar14 = filename_from_str((char *)keyfile);
                                      conf_set_filename(*(Conf **)(arg + 0x108),0x81,pFVar14);
                                      filename_free(pFVar14);
                                      conf_set_int(*(Conf **)(arg + 0x108),0x82,3);
                                      conf_set_int(*(Conf **)(arg + 0x108),0x83,1);
                                    }
                                    else {
                                      _Var4 = longoptarg(val,"--sshrawlog",(char **)&keyfile,
                                                         (int *)&argv_local,(char ***)&ninstances);
                                      if ((_Var4) ||
                                         (_Var4 = longoptarg(val,"-sshrawlog",(char **)&keyfile,
                                                             (int *)&argv_local,
                                                             (char ***)&ninstances), _Var4)) {
                                        pFVar14 = filename_from_str((char *)keyfile);
                                        conf_set_filename(*(Conf **)(arg + 0x108),0x81,pFVar14);
                                        filename_free(pFVar14);
                                        conf_set_int(*(Conf **)(arg + 0x108),0x82,4);
                                        conf_set_int(*(Conf **)(arg + 0x108),0x83,1);
                                      }
                                      else {
                                        iVar5 = strcmp(val,"--pretend-to-accept-any-pubkey");
                                        if (iVar5 == 0) {
                                          arg[0x102] = '\x01';
                                        }
                                        else {
                                          iVar5 = strcmp(val,"--open-unconditional-agent-socket");
                                          if (iVar5 == 0) {
                                            arg[0x103] = '\x01';
                                          }
                                          else {
                                            iVar5 = strcmp(val,"--allow-none-auth");
                                            if (iVar5 == 0) {
                                              *(uint *)(arg + 0x30) = *(uint *)(arg + 0x30) | 1;
                                            }
                                            else {
                                              iVar5 = strcmp(val,"--allow-trivial-ki-auth");
                                              if (iVar5 == 0) {
                                                arg[0x104] = '\x01';
                                              }
                                              else {
                                                iVar5 = strcmp(val,
                                                  "--return-success-to-pubkey-offer");
                                                if (iVar5 != 0) {
                                                  fprintf(_stderr,"%s: unrecognised option \'%s\'\n"
                                                          ,"Uppity",val);
                                                  exit(1);
                                                }
                                                arg[0x105] = '\x01';
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    __stream = fopen((char *)keyfile,"r");
    pFVar3 = _stderr;
    if (__stream == (FILE *)0x0) {
      piVar11 = __errno_location();
      pcVar12 = strerror(*piVar11);
      fprintf(pFVar3,"%s: %s: open: %s\n","Uppity",keyfile,pcVar12);
      exit(1);
    }
    psVar13 = strbuf_new();
    _Var4 = read_file_into(psVar13->binarysink_,(FILE *)__stream);
    pFVar3 = _stderr;
    if (!_Var4) break;
    fclose(__stream);
    pcVar12 = arg;
    pVar15 = ptrlen_from_strbuf(psVar13);
    local_140 = pVar15.ptr;
    *(void **)(pcVar12 + 0x60) = local_140;
    local_138 = pVar15.len;
    *(size_t *)(pcVar12 + 0x68) = local_138;
  }
  piVar11 = __errno_location();
  pcVar12 = strerror(*piVar11);
  fprintf(pFVar3,"%s: %s: read: %s\n","Uppity",keyfile,pcVar12);
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
    size_t ninstances = 0, instancessize = 8;
    struct cmdline_instance *instances = snewn(
        instancessize, struct cmdline_instance);
    struct cmdline_instance *ci = &instances[ninstances++];
    init_cmdline_instance(ci);

    if (argc <= 1) {
        /*
         * We're going to terminate with an error message below,
         * because there are no host keys. But we'll display the help
         * as additional standard-error output, if nothing else so
         * that people see the giant safety warning.
         */
        show_help(stderr);
        fputc('\n', stderr);
    }

    while (--argc > 0) {
        const char *arg = *++argv;
        const char *val;

        if (!strcmp(arg, "--help")) {
            show_help(stdout);
            exit(0);
        } else if (longoptnoarg(arg, "--version")) {
            show_version_and_exit();
        } else if (longoptnoarg(arg, "--verbose") || !strcmp(arg, "-v")) {
            verbose = true;
        } else if (longoptnoarg(arg, "--and")) {
            sgrowarray(instances, instancessize, ninstances);
            ci = &instances[ninstances++];
            init_cmdline_instance(ci);
        } else if (longoptarg(arg, "--listen", &val, &argc, &argv)) {
            if (val[0] == '/') {
                ci->listen_port = -1;
                ci->listen_socket = val;
            } else {
                ci->listen_port = atoi(val);
                ci->listen_socket = NULL;
            }
        } else if (!strcmp(arg, "--listen-once")) {
            listen_once = true;
        } else if (longoptarg(arg, "--hostkey", &val, &argc, &argv)) {
            Filename *keyfile;
            int keytype;
            const char *error;

            keyfile = filename_from_str(val);
            keytype = key_type(keyfile);

            if (keytype == SSH_KEYTYPE_SSH2) {
                ssh2_userkey *uk;
                ssh_key *key;
                uk = ppk_load_f(keyfile, NULL, &error);
                filename_free(keyfile);
                if (!uk || !uk->key) {
                    fprintf(stderr, "%s: unable to load host key '%s': "
                            "%s\n", appname, val, error);
                    exit(1);
                }
                char *invalid = ssh_key_invalid(uk->key, 0);
                if (invalid) {
                    fprintf(stderr, "%s: host key '%s' is unusable: "
                            "%s\n", appname, val, invalid);
                    exit(1);
                }
                key = uk->key;
                sfree(uk->comment);
                sfree(uk);

                for (int i = 0; i < ci->nhostkeys; i++)
                    if (ssh_key_alg(ci->hostkeys[i]) == ssh_key_alg(key)) {
                        fprintf(stderr, "%s: host key '%s' duplicates key "
                                "type %s\n", appname, val,
                                ssh_key_alg(key)->ssh_id);
                        exit(1);
                    }

                sgrowarray(ci->hostkeys, ci->hostkeysize, ci->nhostkeys);
                ci->hostkeys[ci->nhostkeys++] = key;
            } else if (keytype == SSH_KEYTYPE_SSH1) {
                if (ci->hostkey1) {
                    fprintf(stderr, "%s: host key '%s' is a redundant "
                            "SSH-1 host key\n", appname, val);
                    exit(1);
                }
                ci->hostkey1 = snew(RSAKey);
                if (!rsa1_load_f(keyfile, ci->hostkey1, NULL, &error)) {
                    fprintf(stderr, "%s: unable to load host key '%s': "
                            "%s\n", appname, val, error);
                    exit(1);
                }
            } else {
                fprintf(stderr, "%s: '%s' is not loadable as a "
                        "private key (%s)", appname, val,
                        key_type_to_str(keytype));
                exit(1);
            }
        } else if (longoptarg(arg, "--rsakexkey", &val, &argc, &argv)) {
            Filename *keyfile;
            int keytype;
            const char *error;

            keyfile = filename_from_str(val);
            keytype = key_type(keyfile);

            if (keytype != SSH_KEYTYPE_SSH1) {
                fprintf(stderr, "%s: '%s' is not loadable as an SSH-1 format "
                        "private key (%s)", appname, val,
                        key_type_to_str(keytype));
                exit(1);
            }

            if (ci->ssc.rsa_kex_key) {
                freersakey(ci->ssc.rsa_kex_key);
            } else {
                ci->ssc.rsa_kex_key = snew(RSAKey);
            }

            if (!rsa1_load_f(keyfile, ci->ssc.rsa_kex_key, NULL, &error)) {
                fprintf(stderr, "%s: unable to load RSA kex key '%s': "
                        "%s\n", appname, val, error);
                exit(1);
            }

            ci->ssc.rsa_kex_key->sshk.vt = &ssh_rsa;
        } else if (longoptarg(arg, "--userkey", &val, &argc, &argv)) {
            Filename *keyfile;
            int keytype;
            const char *error;

            keyfile = filename_from_str(val);
            keytype = key_type(keyfile);

            if (keytype == SSH_KEYTYPE_SSH2_PUBLIC_RFC4716 ||
                keytype == SSH_KEYTYPE_SSH2_PUBLIC_OPENSSH) {
                strbuf *sb = strbuf_new();
                struct AuthPolicy_ssh2_pubkey *node;
                void *blob;

                if (!ppk_loadpub_f(keyfile, NULL, BinarySink_UPCAST(sb),
                                   NULL, &error)) {
                    fprintf(stderr, "%s: unable to load user key '%s': "
                            "%s\n", appname, val, error);
                    exit(1);
                }

                node = snew_plus(struct AuthPolicy_ssh2_pubkey, sb->len);
                blob = snew_plus_get_aux(node);
                memcpy(blob, sb->u, sb->len);
                node->public_blob = make_ptrlen(blob, sb->len);

                node->next = ci->aps.ssh2keys;
                ci->aps.ssh2keys = node;

                strbuf_free(sb);
            } else if (keytype == SSH_KEYTYPE_SSH1_PUBLIC) {
                strbuf *sb = strbuf_new();
                BinarySource src[1];
                struct AuthPolicy_ssh1_pubkey *node;

                if (!rsa1_loadpub_f(keyfile, BinarySink_UPCAST(sb),
                                    NULL, &error)) {
                    fprintf(stderr, "%s: unable to load user key '%s': "
                            "%s\n", appname, val, error);
                    exit(1);
                }

                node = snew(struct AuthPolicy_ssh1_pubkey);
                BinarySource_BARE_INIT(src, sb->u, sb->len);
                get_rsa_ssh1_pub(src, &node->key, RSA_SSH1_EXPONENT_FIRST);

                node->next = ci->aps.ssh1keys;
                ci->aps.ssh1keys = node;

                strbuf_free(sb);
            } else {
                fprintf(stderr, "%s: '%s' is not loadable as a public key "
                        "(%s)\n", appname, val, key_type_to_str(keytype));
                exit(1);
            }
        } else if (longoptarg(arg, "--bannerfile", &val, &argc, &argv)) {
            FILE *fp = fopen(val, "r");
            if (!fp) {
                fprintf(stderr, "%s: %s: open: %s\n", appname,
                        val, strerror(errno));
                exit(1);
            }
            strbuf *sb = strbuf_new();
            if (!read_file_into(BinarySink_UPCAST(sb), fp)) {
                fprintf(stderr, "%s: %s: read: %s\n", appname,
                        val, strerror(errno));
                exit(1);
            }
            fclose(fp);
            ci->ssc.banner = ptrlen_from_strbuf(sb);
        } else if (longoptarg(arg, "--bannertext", &val, &argc, &argv)) {
            ci->ssc.banner = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--sessiondir", &val, &argc, &argv)) {
            ci->ssc.session_starting_dir = val;
        } else if (longoptarg(arg, "--kexinit-kex", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_KEX] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--kexinit-hostkey", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_HOSTKEY] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--kexinit-cscipher", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_CSCIPHER] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--kexinit-csmac", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_CSMAC] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--kexinit-cscomp", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_CSCOMP] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--kexinit-sccipher", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_SCCIPHER] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--kexinit-scmac", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_SCMAC] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--kexinit-sccomp", &val, &argc, &argv)) {
            ci->ssc.kex_override[KEXLIST_SCCOMP] = ptrlen_from_asciz(val);
        } else if (longoptarg(arg, "--allow-auth", &val, &argc, &argv)) {
            unsigned method = auth_method_from_name(val);
            if (!method) {
                fprintf(stderr, "%s: unrecognised auth method '%s'\n",
                        appname, val);
                exit(1);
            }
            ci->auth_methods |= method;
        } else if (longoptarg(arg, "--deny-auth", &val, &argc, &argv)) {
            unsigned method = auth_method_from_name(val);
            if (!method) {
                fprintf(stderr, "%s: unrecognised auth method '%s'\n",
                        appname, val);
                exit(1);
            }
            ci->auth_methods &= ~method;
        } else if (longoptarg(arg, "--ssh1-ciphers", &val, &argc, &argv)) {
            ptrlen list = ptrlen_from_asciz(val);
            ptrlen word;
            unsigned long mask = 0;
            while (word = ptrlen_get_word(&list, ","), word.len != 0) {

#define SSH1_CIPHER_CASE(bitpos, name)                  \
                if (ptrlen_eq_string(word, name)) {     \
                    mask |= 1U << bitpos;               \
                    continue;                           \
                }
                SSH1_SUPPORTED_CIPHER_LIST(SSH1_CIPHER_CASE);
#undef SSH1_CIPHER_CASE

                fprintf(stderr, "%s: unrecognised SSH-1 cipher '%.*s'\n",
                        appname, PTRLEN_PRINTF(word));
                exit(1);
            }
            ci->ssc.ssh1_cipher_mask = mask;
        } else if (longoptnoarg(arg, "--ssh1-no-compression")) {
            ci->ssc.ssh1_allow_compression = false;
        } else if (longoptnoarg(arg, "--exitsignum")) {
            ci->ssc.exit_signal_numeric = true;
        } else if (longoptarg(arg, "--sshlog", &val, &argc, &argv) ||
                   longoptarg(arg, "-sshlog", &val, &argc, &argv)) {
            Filename *logfile = filename_from_str(val);
            conf_set_filename(ci->conf, CONF_logfilename, logfile);
            filename_free(logfile);
            conf_set_int(ci->conf, CONF_logtype, LGTYP_PACKETS);
            conf_set_int(ci->conf, CONF_logxfovr, LGXF_OVR);
        } else if (longoptarg(arg, "--sshrawlog", &val, &argc, &argv) ||
                   longoptarg(arg, "-sshrawlog", &val, &argc, &argv)) {
            Filename *logfile = filename_from_str(val);
            conf_set_filename(ci->conf, CONF_logfilename, logfile);
            filename_free(logfile);
            conf_set_int(ci->conf, CONF_logtype, LGTYP_SSHRAW);
            conf_set_int(ci->conf, CONF_logxfovr, LGXF_OVR);
        } else if (!strcmp(arg, "--pretend-to-accept-any-pubkey")) {
            ci->ssc.stunt_pretend_to_accept_any_pubkey = true;
        } else if (!strcmp(arg, "--open-unconditional-agent-socket")) {
            ci->ssc.stunt_open_unconditional_agent_socket = true;
        } else if (!strcmp(arg, "--allow-none-auth")) {
            /* backwards-compatibility synonym for --allow-auth=none */
            ci->auth_methods |= AUTHMETHOD_NONE;
        } else if (!strcmp(arg, "--allow-trivial-ki-auth")) {
            ci->ssc.stunt_allow_trivial_ki_auth = true;
        } else if (!strcmp(arg, "--return-success-to-pubkey-offer")) {
            ci->ssc.stunt_return_success_to_pubkey_offer = true;
        } else {
            fprintf(stderr, "%s: unrecognised option '%s'\n", appname, arg);
            exit(1);
        }
    }

    if (ninstances > 1 && listen_once) {
        fprintf(stderr, "%s: cannot listen once only with multiple server "
                "instances\n", appname);
        exit(1);
    }
    for (size_t i = 0; i < ninstances; i++) {
        ci = &instances[i];
        if (ci->nhostkeys == 0 && !ci->hostkey1) {
            fprintf(stderr, "%s: specify at least one host key\n", appname);
            exit(1);
        }
        if (ninstances > 1 && !(ci->listen_port >= 0 || ci->listen_socket)) {
            fprintf(stderr, "%s: cannot talk to stdio with multiple server "
                    "instances\n", appname);
            exit(1);
        }
    }

    random_ref();

    /*
     * Block SIGPIPE, so that we'll get EPIPE individually on
     * particular network connections that go wrong.
     */
    putty_signal(SIGPIPE, SIG_IGN);

    sk_init();
    uxsel_init();

    for (size_t i = 0; i < ninstances; i++)
        cmdline_instance_start(&instances[i]);

    cli_main_loop(cliloop_no_pw_setup, cliloop_no_pw_check,
                  cliloop_always_continue, NULL);

    return 0;
}